

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse-matrix.hpp
# Opt level: O1

tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
 __thiscall baryonyx::sparse_matrix<int>::row(sparse_matrix<int> *this,int row)

{
  int iVar1;
  long lVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  long *plVar3;
  tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
  tVar4;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,row);
  if (((-1 < (int)in_EDX) && ((int)plVar3[3] != 1)) && (in_EDX < (int)plVar3[1] - 1U)) {
    lVar2 = plVar3[4];
    iVar1 = *(int *)(*plVar3 + (ulong)in_EDX * 4);
    (this->m_rows_access).m_buffer._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
    .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
         = (_Head_base<0UL,_int_*,_false>)
           (lVar2 + (long)*(int *)(*plVar3 + 4 + (ulong)in_EDX * 4) * 8);
    *(long *)&(this->m_rows_access).m_length = lVar2 + (long)iVar1 * 8;
    tVar4.
    super__Tuple_impl<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Head_base<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl.
    _0_4_ = in_EDX;
    tVar4.
    super__Tuple_impl<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Tuple_impl<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*>.
    super__Head_base<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (_Head_base<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>)
         (_Head_base<1UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>)this;
    tVar4.
    super__Tuple_impl<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
    .super__Head_base<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl.
    _4_4_ = 0;
    return (tuple<const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
            )tVar4.
             super__Tuple_impl<0UL,_const_baryonyx::sparse_matrix<int>::row_value_*,_const_baryonyx::sparse_matrix<int>::row_value_*>
    ;
  }
  sparse_matrix<int>::row();
}

Assistant:

std::tuple<const_row_iterator, const_row_iterator> row(int row) const
      noexcept
    {
        bx_expects(m_is_valid_index(row, 0));

        const_row_iterator begin = m_rows_values.begin() + m_rows_access[row];
        const_row_iterator end =
          m_rows_values.begin() + m_rows_access[row + 1];

        return std::make_tuple(begin, end);
    }